

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O1

sunrealtype **
SplittingStepCoefficients_ComposeStrangHelper
          (int partitions,int order,int composition_stages,sunrealtype start,sunrealtype end,
          sunrealtype **beta)

{
  sunrealtype start_00;
  sunrealtype *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  sunrealtype end_00;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  
  auVar3 = _DAT_001833d0;
  auVar2 = _DAT_001833c0;
  if (order == 2) {
    if (0 < partitions) {
      dVar13 = (end - start) * 0.5 + start;
      lVar4 = (ulong)(uint)partitions - 1;
      auVar9._8_4_ = (int)lVar4;
      auVar9._0_8_ = lVar4;
      auVar9._12_4_ = (int)((ulong)lVar4 >> 0x20);
      uVar5 = 1;
      iVar6 = 2;
      auVar9 = auVar9 ^ _DAT_001833d0;
      do {
        psVar1 = beta[uVar5];
        uVar7 = 0;
        auVar11 = auVar2;
        do {
          auVar12 = auVar11 ^ auVar3;
          if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                      auVar9._4_4_ < auVar12._4_4_) & 1)) {
            dVar10 = dVar13;
            if (partitions <= (int)uVar5 + (int)uVar7) {
              dVar10 = end;
            }
            psVar1[uVar7] = dVar10;
          }
          if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
              auVar12._12_4_ <= auVar9._12_4_) {
            dVar10 = dVar13;
            if (partitions <= iVar6 + (int)uVar7) {
              dVar10 = end;
            }
            psVar1[uVar7 + 1] = dVar10;
          }
          uVar7 = uVar7 + 2;
          lVar4 = auVar11._8_8_;
          auVar11._0_8_ = auVar11._0_8_ + 2;
          auVar11._8_8_ = lVar4 + 2;
        } while ((partitions + 1U & 0xfffffffe) != uVar7);
        uVar5 = uVar5 + 1;
        iVar6 = iVar6 + 1;
      } while (uVar5 != partitions + 1U);
    }
    beta = beta + (long)partitions + -1;
  }
  else {
    dVar13 = pow((double)(composition_stages + -1),1.0 / (double)(order + -1));
    if (0 < composition_stages) {
      dVar10 = (end - start) / ((double)(composition_stages + -1) - dVar13);
      iVar6 = 1 - composition_stages;
      iVar8 = 2;
      dVar13 = 1.0;
      start_00 = start;
      do {
        if (iVar8 < composition_stages) {
          end_00 = dVar13 * dVar10 + start;
        }
        else {
          end_00 = (double)iVar6 * dVar10 + end;
        }
        beta = SplittingStepCoefficients_ComposeStrangHelper
                         (partitions,order + -2,composition_stages,start_00,end_00,beta);
        dVar13 = dVar13 + 1.0;
        iVar6 = iVar6 + 1;
        iVar8 = iVar8 + 2;
        start_00 = end_00;
      } while (iVar6 != 1);
    }
  }
  return beta;
}

Assistant:

static sunrealtype* const* SplittingStepCoefficients_ComposeStrangHelper(
  const int partitions, const int order, const int composition_stages,
  const sunrealtype start, const sunrealtype end, sunrealtype* const* const beta)
{
  const sunrealtype diff = end - start;
  if (order == 2)
  {
    /* The base case is an order 2 Strang splitting */
    const sunrealtype mid = start + diff / SUN_RCONST(2.0);
    for (int j = 1; j <= partitions; j++)
    {
      for (int k = 0; k < partitions; k++)
      {
        beta[j][k] = (k + j < partitions) ? mid : end;
      }
    }

    return &beta[partitions - 1];
  }

  sunrealtype* const* beta_cur = beta;
  sunrealtype start_cur        = start;
  /* This is essentially the gamma coefficient from Geometric Numerical
   * Integration (https://doi.org/10.1007/3-540-30666-8) pg 44-45 scaled by the
   * current interval */
  const sunrealtype gamma =
    diff / (composition_stages - 1 -
            SUNRpowerR(composition_stages - 1, SUN_RCONST(1.0) / (order - 1)));
  for (int i = 1; i <= composition_stages; i++)
  {
    /* To avoid roundoff issues, this ensures end_cur=1 for the last value of i*/
    const sunrealtype end_cur = 2 * i < composition_stages
                                  ? (start + i * gamma)
                                  : (end + (i - composition_stages) * gamma);
    /* Recursively generate coefficients and shift beta_cur */
    beta_cur  = SplittingStepCoefficients_ComposeStrangHelper(partitions,
                                                              order - 2,
                                                              composition_stages,
                                                              start_cur, end_cur,
                                                              beta_cur);
    start_cur = end_cur;
  }

  return beta_cur;
}